

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O1

int BN_mod_lshift_quick(BIGNUM *r,BIGNUM *a,int n,BIGNUM *m)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BIGNUM *pBVar4;
  int iVar5;
  
  if ((r == a) || (pBVar4 = BN_copy(r,a), pBVar4 != (BIGNUM *)0x0)) {
    do {
      if (n < 1) {
        return 1;
      }
      iVar2 = BN_num_bits(m);
      iVar3 = BN_num_bits(r);
      iVar5 = iVar2 - iVar3;
      if (iVar5 < 0) {
LAB_001133c2:
        bVar1 = false;
      }
      else {
        if (n <= iVar5) {
          iVar5 = n;
        }
        if (iVar2 != iVar3) {
          iVar2 = BN_lshift(r,r,iVar5);
          if (iVar2 != 0) {
            n = n - iVar5;
            goto LAB_0011339d;
          }
          goto LAB_001133c2;
        }
        iVar5 = BN_lshift1(r,r);
        if (iVar5 == 0) goto LAB_001133c2;
        n = n + -1;
LAB_0011339d:
        iVar5 = BN_cmp(r,m);
        if ((-1 < iVar5) && (iVar5 = BN_sub(r,r,m), iVar5 == 0)) goto LAB_001133c2;
        bVar1 = true;
      }
    } while (bVar1);
  }
  return 0;
}

Assistant:

int BN_mod_lshift_quick(BIGNUM *r, const BIGNUM *a, int n, const BIGNUM *m)
{
    if (r != a) {
        if (BN_copy(r, a) == NULL)
            return 0;
    }

    while (n > 0) {
        int max_shift;

        /* 0 < r < m */
        max_shift = BN_num_bits(m) - BN_num_bits(r);
        /* max_shift >= 0 */

        if (max_shift < 0) {
            //BNerr(BN_F_BN_MOD_LSHIFT_QUICK, BN_R_INPUT_NOT_REDUCED);
            return 0;
        }

        if (max_shift > n)
            max_shift = n;

        if (max_shift) {
            if (!BN_lshift(r, r, max_shift))
                return 0;
            n -= max_shift;
        } else {
            if (!BN_lshift1(r, r))
                return 0;
            --n;
        }

        /* BN_num_bits(r) <= BN_num_bits(m) */

        if (BN_cmp(r, m) >= 0) {
            if (!BN_sub(r, r, m))
                return 0;
        }
    }
    bn_check_top(r);

    return 1;
}